

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O1

int compute_all_decl(uint32_t dst,uint32_t src1)

{
  return dst >> 0x18 & 0xffffff80 | src1 | (uint)(dst == 0) << 6 |
         (uint)(dst == 0x7fffffff) << 0xb | (dst + 1 ^ dst) & 0x10 | (uint)"\x04"[dst & 0xff];
}

Assistant:

static int glue(compute_all_dec, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src2;

    cf = (int)src1;
    src1 = dst + 1;
    src2 = 1;
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & CC_A;
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = (dst == SIGN_MASK - 1) * CC_O;
    return cf | pf | af | zf | sf | of;
}